

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O1

void __thiscall
soplex::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMax(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int newmax)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newmem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_20;
  
  uVar3 = (this->
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).memused;
  if (newmax < (int)uVar3) {
    newmax = uVar3;
  }
  if (newmax != (this->
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).memsize) {
    local_20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_20,newmax);
    if ((int)uVar3 < 1) {
      uVar8 = 0;
    }
    else {
      lVar9 = 0x38;
      uVar8 = 0;
      do {
        pNVar4 = this->theelem;
        *(undefined8 *)((long)(local_20->val).m_backend.data._M_elems + lVar9 + -0x18) =
             *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0x18);
        puVar1 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar9);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar9);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)(&(local_20->val).m_backend.data + -1) + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)(&local_20->val + -1) + lVar9);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        *(undefined4 *)((long)(local_20->val).m_backend.data._M_elems + lVar9 + -0x10) =
             *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0x10);
        *(undefined1 *)((long)(local_20->val).m_backend.data._M_elems + lVar9 + -0xc) =
             *(undefined1 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0xc);
        *(undefined8 *)((long)(local_20->val).m_backend.data._M_elems + lVar9 + -8) =
             *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -8);
        *(undefined4 *)((long)(local_20->val).m_backend.data._M_elems + lVar9) =
             *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x3c;
      } while (uVar3 != uVar8);
    }
    if ((int)uVar8 < newmax) {
      piVar10 = &local_20[uVar8 & 0xffffffff].idx;
      lVar9 = (ulong)(uint)newmax - (uVar8 & 0xffffffff);
      do {
        *(undefined8 *)(piVar10 + -2) = 0xa00000000;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar10 + -0xe))->val).m_backend.data._M_elems[0] = 0;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar10 + -0xe))->val).m_backend.data._M_elems[1] = 0;
        (piVar10 + -0xc)[0] = 0;
        (piVar10 + -0xc)[1] = 0;
        (piVar10 + -10)[0] = 0;
        (piVar10 + -10)[1] = 0;
        (piVar10 + -8)[0] = 0;
        (piVar10 + -8)[1] = 0;
        *(undefined8 *)((long)piVar10 + -0x1b) = 0;
        *(undefined8 *)((long)piVar10 + -0x13) = 0;
        *piVar10 = 0;
        piVar10 = piVar10 + 0xf;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (this->theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(this->theelem);
      this->theelem =
           (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
    }
    this->theelem = local_20;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_elem = local_20;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memsize = newmax;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memused = uVar3;
  }
  return;
}

Assistant:

void setMax(int newmax = 1)
   {
      int siz = SVectorBase<R>::size();
      int len = (newmax < siz) ? siz : newmax;

      if(len == SVectorBase<R>::max())
         return;

      Nonzero<R>* newmem = nullptr;

      /* allocate new memory */
      spx_alloc(newmem, len);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < siz; i++)
         new((&newmem[i])) Nonzero<R>(theelem[i]);

      /* call default constructor for remaining elements */
      for(; i < len; i++)
         new((&newmem[i])) Nonzero<R>();

      /* free old memory */
      for(i = SVectorBase<R>::max() - 1; i >= 0; i--)
         theelem[i].~Nonzero<R>();

      if(theelem != nullptr)
         spx_free(theelem);

      /* assign new memory */
      theelem = newmem;
      SVectorBase<R>::setMem(len, theelem);
      SVectorBase<R>::set_size(siz);
   }